

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86OR(uchar *stream,x86Reg op1,int num)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  int num_local;
  x86Reg op1_local;
  uchar *stream_local;
  
  uVar2 = encodeRex(stream,false,rNONE,rNONE,op1);
  puVar3 = stream + uVar2;
  if (op1 == rEAX) {
    *puVar3 = '\r';
    uVar2 = encodeImmDword(puVar3 + 1,num);
    stream_local._4_4_ = ((int)(puVar3 + 1) + uVar2) - (int)stream;
  }
  else {
    *puVar3 = 0x81;
    uVar1 = encodeRegister(op1,'\x01');
    puVar3[1] = uVar1;
    uVar2 = encodeImmDword(puVar3 + 2,num);
    stream_local._4_4_ = ((int)(puVar3 + 2) + uVar2) - (int)stream;
  }
  return stream_local._4_4_;
}

Assistant:

int x86OR(unsigned char *stream, x86Reg op1, int num)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, rNONE, rNONE, op1);

	if(op1 == rEAX)
	{
		*stream++ = 0x0d;
		stream += encodeImmDword(stream, num);

		return int(stream - start);
	}

	*stream++ = 0x81;
	*stream++ = encodeRegister(op1, 1);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}